

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_seek_seconds
                    (ma_data_source *pDataSource,float secondCount,float *pSecondsSeeked)

{
  float *in_RSI;
  ma_uint32 *in_RDI;
  undefined4 in_XMM0_Da;
  ma_result result;
  ma_uint32 sampleRate;
  ma_uint64 framesSeeked;
  ma_uint64 frameCount;
  uint in_stack_ffffffffffffffcc;
  ma_data_source *pDataSource_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  pDataSource_00 = (ma_data_source *)0x0;
  if (in_RDI == (ma_uint32 *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_data_source_get_data_format
                      ((ma_data_source *)framesSeeked,_result,
                       (ma_uint32 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(ma_channel *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                       (size_t)in_RSI);
    if (mVar1 == MA_SUCCESS) {
      mVar1 = ma_data_source_seek_pcm_frames
                        (pDataSource_00,(ulong)in_stack_ffffffffffffffcc << 0x20,
                         (ma_uint64 *)0x1dc703);
      *in_RSI = (float)(long)pDataSource_00 / (float)in_stack_ffffffffffffffcc;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_seek_seconds(ma_data_source* pDataSource, float secondCount, float* pSecondsSeeked)
{
    ma_uint64 frameCount;
    ma_uint64 framesSeeked = 0;
    ma_uint32 sampleRate;
    ma_result result;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need PCM frames instead of seconds */
    frameCount = (ma_uint64)(secondCount * sampleRate);

    result = ma_data_source_seek_pcm_frames(pDataSource, frameCount, &framesSeeked);

    /* VC6 doesn't support division between unsigned 64-bit integer and floating point number. Signed integer needed. This shouldn't affect anything in practice */
    *pSecondsSeeked = (ma_int64)framesSeeked / (float)sampleRate;
    return result;
}